

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticClient.cpp
# Opt level: O3

void __thiscall
slang::DiagnosticClient::setEngine(DiagnosticClient *this,DiagnosticEngine *newEngine)

{
  runtime_error *this_00;
  
  if (this->engine == newEngine || this->engine == (DiagnosticEngine *)0x0) {
    this->engine = newEngine;
    this->sourceManager = newEngine->sourceManager;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Diagnostic client already has a different engine set");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DiagnosticClient::setEngine(const DiagnosticEngine& newEngine) {
    if (engine && engine != &newEngine)
        SLANG_THROW(std::runtime_error("Diagnostic client already has a different engine set"));

    engine = &newEngine;
    sourceManager = &engine->getSourceManager();
}